

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O2

void shade_rect(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Fl_Color FVar6;
  uchar *puVar7;
  size_t sVar8;
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint local_98;
  
  uVar13 = (ulong)(uint)y;
  puVar7 = fl_gray_ramp();
  sVar8 = strlen(c);
  iVar2 = (int)sVar8;
  iVar11 = iVar2 + -1;
  iVar1 = iVar11 / 2;
  if (h < w * 2) {
    iVar2 = (h < iVar2) + 1;
    uVar3 = x + 1;
    uVar4 = w + -2 + x;
    uVar5 = w + -1 + x;
    pcVar10 = c + iVar11;
    pcVar9 = c;
    uVar12 = h + y;
    local_98 = y;
    for (iVar11 = 0; iVar11 < iVar1; iVar11 = iVar11 + iVar2) {
      FVar6 = shade_color(puVar7[*pcVar9],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)uVar3,(ulong)local_98,(ulong)uVar4);
      FVar6 = shade_color(puVar7[(long)*pcVar9 + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      local_98 = local_98 + 1;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,x,(ulong)local_98);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,(ulong)uVar5,(ulong)local_98);
      FVar6 = shade_color(puVar7[*pcVar10],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)uVar3,(ulong)uVar12,(ulong)uVar4);
      FVar6 = shade_color(puVar7[(long)*pcVar10 + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,x,(ulong)uVar12);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,(ulong)uVar5,(ulong)uVar12);
      uVar12 = uVar12 - 1;
      pcVar9 = pcVar9 + 1;
      pcVar10 = pcVar10 + -1;
    }
    iVar2 = iVar1 / iVar2;
    FVar6 = shade_color(puVar7[c[iVar1]],bc);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
    uVar12 = y + iVar2;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar3,(ulong)uVar12,(ulong)(w - 2),
               (ulong)(h + iVar2 * -2 + 1));
    FVar6 = shade_color(puVar7[(long)c[iVar1] + -2],bc);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
    uVar3 = (h + y) - iVar2;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
              (fl_graphics_driver,x,(ulong)uVar12,(ulong)uVar3);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9];
  }
  else {
    iVar2 = (w < iVar2) + 1;
    uVar3 = y + 1;
    uVar12 = h + y;
    uVar5 = h + -1 + y;
    uVar4 = w + -2 + x;
    pcVar10 = c + iVar11;
    pcVar9 = c;
    local_98 = x;
    for (iVar11 = 0; iVar11 < iVar1; iVar11 = iVar11 + iVar2) {
      FVar6 = shade_color(puVar7[*pcVar9],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,(ulong)local_98,(ulong)uVar3,(ulong)uVar5);
      FVar6 = shade_color(puVar7[(long)*pcVar9 + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      local_98 = local_98 + 1;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,(ulong)local_98,uVar13);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,(ulong)local_98,(ulong)uVar12);
      FVar6 = shade_color(puVar7[*pcVar10],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,(ulong)(uVar4 + 1),(ulong)uVar3,(ulong)uVar5);
      FVar6 = shade_color(puVar7[(long)*pcVar10 + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,(ulong)uVar4,uVar13);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,(ulong)uVar4,(ulong)uVar12);
      uVar4 = uVar4 - 1;
      pcVar9 = pcVar9 + 1;
      pcVar10 = pcVar10 + -1;
    }
    iVar2 = iVar1 / iVar2;
    FVar6 = shade_color(puVar7[c[iVar1]],bc);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
    uVar5 = x + iVar2;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar5,(ulong)uVar3,(ulong)(uint)(w + iVar2 * -2),
               (ulong)(h - 1));
    FVar6 = shade_color(puVar7[(long)c[iVar1] + -2],bc);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
    uVar3 = (w + x) - iVar2;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)uVar5,uVar13,(ulong)uVar3);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6];
  }
  (*UNRECOVERED_JUMPTABLE)(fl_graphics_driver,(ulong)uVar5,(ulong)uVar12,(ulong)uVar3);
  return;
}

Assistant:

static void shade_rect(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i, j;
  int	clen = (int) strlen(c) - 1;
  int	chalf = clen / 2;
  int	cstep = 1;

  if (h < (w * 2)) {
    // Horizontal shading...
    if (clen >= h) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the top line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_xyline(x + 1, y + i, x + w - 2);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x, y + i + 1);
      fl_point(x + w - 1, y + i + 1);

      // Draw the bottom line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_xyline(x + 1, y + h - i, x + w - 2);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x, y + h - i);
      fl_point(x + w - 1, y + h - i);
    }

    // Draw the interior and sides...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + 1, y + i, w - 2, h - 2 * i + 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_yxline(x, y + i, y + h - i);
    fl_yxline(x + w - 1, y + i, y + h - i);
  } else {
    // Vertical shading...
    if (clen >= w) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the left line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_yxline(x + i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x + i + 1, y);
      fl_point(x + i + 1, y + h);

      // Draw the right line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_yxline(x + w - 1 - i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x + w - 2 - i, y);
      fl_point(x + w - 2 - i, y + h);
    }

    // Draw the interior, top, and bottom...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + i, y + 1, w - 2 * i, h - 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_xyline(x + i, y, x + w - i);
    fl_xyline(x + i, y + h, x + w - i);
  }
}